

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Destroy(sqlite3_pcache *p)

{
  long lVar1;
  long *in_RDI;
  PGroup *pGroup;
  PCache1 *pCache;
  
  lVar1 = *in_RDI;
  if ((int)in_RDI[7] != 0) {
    pcache1TruncateUnsafe((PCache1 *)pGroup,(uint)((ulong)in_RDI >> 0x20));
  }
  *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) - *(int *)((long)in_RDI + 0x24);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) - (int)in_RDI[4];
  *(int *)(lVar1 + 0x10) = (*(int *)(lVar1 + 8) + 10) - *(int *)(lVar1 + 0xc);
  pcache1EnforceMaxPage((PCache1 *)pGroup);
  sqlite3_free((void *)0x23b1f2);
  sqlite3_free((void *)0x23b200);
  sqlite3_free((void *)0x23b20a);
  return;
}

Assistant:

static void pcache1Destroy(sqlite3_pcache *p){
  PCache1 *pCache = (PCache1 *)p;
  PGroup *pGroup = pCache->pGroup;
  assert( pCache->bPurgeable || (pCache->nMax==0 && pCache->nMin==0) );
  pcache1EnterMutex(pGroup);
  if( pCache->nPage ) pcache1TruncateUnsafe(pCache, 0);
  assert( pGroup->nMaxPage >= pCache->nMax );
  pGroup->nMaxPage -= pCache->nMax;
  assert( pGroup->nMinPage >= pCache->nMin );
  pGroup->nMinPage -= pCache->nMin;
  pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
  pcache1EnforceMaxPage(pCache);
  pcache1LeaveMutex(pGroup);
  sqlite3_free(pCache->pBulk);
  sqlite3_free(pCache->apHash);
  sqlite3_free(pCache);
}